

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O1

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackStartDocument(void *context)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Map_pointer ppsVar3;
  size_t sVar4;
  char cVar5;
  _Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  *p_Var6;
  _Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  local_68;
  
  p_Var6 = &local_68;
  if (*(char *)(*context + 0x1a1) == '\x01') {
    iDynTree::reportInfo("XMLParser","parserCallbackStartDocument","Start document");
  }
  local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::_M_initialize_map(&local_68,0);
  std::
  deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::_M_move_assign1((deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
                     *)(*context + 0x100),&local_68);
  std::
  deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::~deque((deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
            *)&local_68);
  lVar1 = *context;
  if (*(long *)(lVar1 + 0x160) != 0) {
    (**(code **)(lVar1 + 0x168))(&local_68,lVar1 + 0x150,lVar1 + 0x1c0);
    sVar4 = local_68._M_impl.super__Deque_impl_data._M_map_size;
    ppsVar3 = local_68._M_impl.super__Deque_impl_data._M_map;
    lVar1 = *context;
    local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x178);
    *(_Map_pointer *)(lVar1 + 0x170) = ppsVar3;
    *(size_t *)(lVar1 + 0x178) = sVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68._M_impl.super__Deque_impl_data._M_map_size !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68._M_impl.super__Deque_impl_data._M_map_size);
    }
    return;
  }
  std::__throw_bad_function_call();
  if (*(char *)(*(long *)p_Var6 + 0x1a1) == '\x01') {
    iDynTree::reportInfo("XMLParser","parserCallbackEndDocument","End document");
  }
  cVar5 = (**(code **)(**(long **)(*(long *)p_Var6 + 0x170) + 0x18))();
  if (cVar5 == '\0') {
    iDynTree::reportError
              ("XMLParser","parserCallbackEndDocument","Document final callback failed processing");
  }
  lVar1 = *(long *)p_Var6;
  if (*(long *)(lVar1 + 0x130) != *(long *)(lVar1 + 0x110)) {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x178);
    *(undefined8 *)(lVar1 + 0x170) = 0;
    *(undefined8 *)(lVar1 + 0x178) = 0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    iDynTree::reportError("XMLParser","parserCallbackEndDocument","Unbalanced tags in the document")
    ;
    return;
  }
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackStartDocument(void* context)
    {
        XMLParser *state = static_cast<XMLParser*>(context);
        if (state->m_pimpl->m_logParsing) {
            reportInfo("XMLParser", "parserCallbackStartDocument", "Start document");
        }
        // clear stack
        state->m_pimpl->m_parsedTrace = std::stack<std::shared_ptr<XMLElement>>();
        // create a Document type
        state->m_pimpl->m_document = std::shared_ptr<XMLDocument>(
            state->m_pimpl->f_documentFactory(state->m_pimpl->m_parserState));
    }